

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

Status __thiscall
soplex::SoPlexBase<double>::_solveRealStable
          (SoPlexBase<double> *this,bool acceptUnbounded,bool acceptInfeasible,
          VectorBase<double> *primal,VectorBase<double> *dual,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusRows,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusCols,
          bool forceNoSimplifier)

{
  SPxSolverBase<double> *this_00;
  int value;
  int value_00;
  int iVar1;
  int value_01;
  int value_02;
  Verbosity VVar2;
  Settings *pSVar3;
  ostream *poVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  Status SVar15;
  SPxOut *pSVar16;
  int iVar17;
  Verbosity old_verbosity_1;
  bool fromscratch;
  bool bVar18;
  bool bVar19;
  Verbosity old_verbosity;
  double dVar20;
  double dVar21;
  
  dVar21 = (this->_slufactor).lastThreshold;
  pSVar3 = this->_currentSettings;
  value = pSVar3->_intParamValues[0xe];
  value_00 = pSVar3->_intParamValues[0xd];
  iVar1 = pSVar3->_intParamValues[2];
  value_01 = pSVar3->_intParamValues[10];
  value_02 = pSVar3->_intParamValues[0xb];
  if (forceNoSimplifier) {
    setIntParam(this,SIMPLIFIER,0,true);
  }
  this_00 = &this->_solver;
  bVar19 = true;
  bVar12 = false;
  bVar8 = false;
  bVar13 = false;
  bVar14 = false;
  bVar18 = false;
  bVar6 = false;
  bVar5 = false;
  bVar10 = false;
  bVar11 = false;
  fromscratch = false;
LAB_003472b2:
  SVar15 = _solveRealForRational(this,fromscratch,primal,dual,basisStatusRows,basisStatusCols);
  bVar9 = true;
  if ((SVar15 != OPTIMAL) && ((SVar15 != INFEASIBLE || (!acceptInfeasible)))) {
    bVar9 = SVar15 == UNBOUNDED && acceptUnbounded;
  }
  if (((uint)(SVar15 + (INForUNBD|INFEASIBLE)) < 2) || (bVar9)) goto LAB_00347c4e;
  if (bVar19) {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Numerical troubles during floating-point solve.",0x2f)
      ;
      poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar7 = (char)poVar4;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar2;
    }
    bVar19 = false;
  }
  if ((bVar18) ||
     ((this->_currentSettings->_intParamValues[10] == 0 &&
      (this->_currentSettings->_intParamValues[0xb] == 0)))) {
    setIntParam(this,SCALER,value_02,true);
    setIntParam(this,SIMPLIFIER,value_01,true);
    if (!bVar10) {
      VVar2 = (this->spxout).m_verbosity;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Increasing Markowitz threshold.",0x1f);
        poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
        cVar7 = (char)poVar4;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
        (this->spxout).m_verbosity = VVar2;
      }
      (this->_slufactor).lastThreshold = 0.9;
      (this->_slufactor).minThreshold = 0.9;
      bVar10 = true;
      SPxSolverBase<double>::factorize(this_00);
      goto LAB_003472b2;
    }
    if (!bVar11) {
      VVar2 = (this->spxout).m_verbosity;
      bVar11 = true;
      fromscratch = true;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Solving from scratch.",0x15);
        poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
        cVar7 = (char)poVar4;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
        (this->spxout).m_verbosity = VVar2;
        fromscratch = true;
      }
      goto LAB_003472b2;
    }
    setIntParam(this,RATIOTESTER,value,true);
    setIntParam(this,PRICER,value_00,true);
    if (bVar12) {
      if (!bVar8 && !forceNoSimplifier) {
        VVar2 = (this->spxout).m_verbosity;
        if (2 < (int)VVar2) {
          (this->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->spxout).m_streams[3],"Switching simplification.",0x19);
          poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
          cVar7 = (char)poVar4;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
          (this->spxout).m_verbosity = VVar2;
        }
        if (value_01 == 0) {
          iVar17 = 3;
        }
        else {
          iVar17 = 0;
        }
        setIntParam(this,SIMPLIFIER,iVar17,true);
        bVar8 = true;
        goto LAB_003475aa;
      }
      setIntParam(this,SIMPLIFIER,0,true);
      if (bVar5) {
        if ((SVar15 == INFEASIBLE) || (bVar6)) {
          if ((DAT_003b9f60 <= iVar1) && (iVar1 <= DAT_003b9fd0)) {
            this->_currentSettings->_intParamValues[2] = iVar1;
          }
          if (bVar13) {
            if (bVar14) {
              VVar2 = (this->spxout).m_verbosity;
              if (2 < (int)VVar2) {
                (this->spxout).m_verbosity = INFO1;
                pSVar16 = operator<<(&this->spxout,"Giving up.");
                std::endl<char,std::char_traits<char>>(pSVar16->m_streams[pSVar16->m_verbosity]);
                (this->spxout).m_verbosity = VVar2;
              }
LAB_00347c4e:
              dVar20 = 0.0001;
              if (0.0001 <= dVar21) {
                dVar20 = dVar21;
              }
              dVar21 = 0.9999;
              if (dVar20 <= 0.9999) {
                dVar21 = dVar20;
              }
              (this->_slufactor).minThreshold = dVar21;
              (this->_slufactor).lastThreshold = dVar21;
              setIntParam(this,RATIOTESTER,value,true);
              setIntParam(this,PRICER,value_00,true);
              setIntParam(this,SIMPLIFIER,value_01,true);
              setIntParam(this,SCALER,value_02,true);
              if ((DAT_003b9f60 <= iVar1) && (iVar1 <= DAT_003b9fd0)) {
                this->_currentSettings->_intParamValues[2] = iVar1;
              }
              return SVar15;
            }
            VVar2 = (this->spxout).m_verbosity;
            if (2 < (int)VVar2) {
              (this->spxout).m_verbosity = INFO1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->spxout).m_streams[3],"Switching pricer.",0x11);
              poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
              cVar7 = (char)poVar4;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar7);
              std::ostream::put(cVar7);
              std::ostream::flush();
              (this->spxout).m_verbosity = VVar2;
            }
            SPxSolverBase<double>::setType
                      (this_00,(uint)((this->_solver).theType != LEAVE) * 2 + ENTER);
            if ((SPxDevexPR<double> *)(this->_solver).thepricer == &this->_pricerDevex) {
              bVar11 = false;
              bVar14 = true;
              if (4 < DAT_003b9ffc && DAT_003b9f8c < 6) {
                bVar11 = false;
                SPxSolverBase<double>::setPricer
                          (this_00,(SPxPricer<double> *)&this->_pricerSteep,false);
                this->_currentSettings->_intParamValues[0xd] = 5;
              }
            }
            else {
              bVar11 = false;
              bVar14 = true;
              if (2 < DAT_003b9ffc && DAT_003b9f8c < 4) {
                bVar11 = false;
                SPxSolverBase<double>::setPricer
                          (this_00,&(this->_pricerDevex).super_SPxPricer<double>,false);
                this->_currentSettings->_intParamValues[0xd] = 3;
              }
            }
          }
          else {
            VVar2 = (this->spxout).m_verbosity;
            if (2 < (int)VVar2) {
              (this->spxout).m_verbosity = INFO1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->spxout).m_streams[3],"Switching ratio test.",0x15);
              poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
              cVar7 = (char)poVar4;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar7);
              std::ostream::put(cVar7);
              std::ostream::flush();
              (this->spxout).m_verbosity = VVar2;
            }
            SPxSolverBase<double>::setType
                      (this_00,(uint)((this->_solver).theType != LEAVE) * 2 + ENTER);
            if ((this->_solver).theratiotester ==
                &(this->_ratiotesterTextbook).super_SPxRatioTester<double>) {
              bVar11 = false;
              bVar13 = true;
              if (1 < DAT_003ba000 && DAT_003b9f90 < 3) {
                bVar11 = false;
                SPxSolverBase<double>::setTester
                          (this_00,&(this->_ratiotesterFast).super_SPxRatioTester<double>,false);
                this->_currentSettings->_intParamValues[0xe] = 2;
              }
            }
            else {
              bVar11 = false;
              bVar13 = true;
              if (-1 < DAT_003ba000 && DAT_003b9f90 < 1) {
                bVar11 = false;
                SPxSolverBase<double>::setTester
                          (this_00,&(this->_ratiotesterTextbook).super_SPxRatioTester<double>,false)
                ;
                this->_currentSettings->_intParamValues[0xe] = 0;
              }
            }
          }
        }
        else {
          VVar2 = (this->spxout).m_verbosity;
          if (2 < (int)VVar2) {
            (this->spxout).m_verbosity = INFO1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->spxout).m_streams[3],"Tightening tolerances.",0x16);
            poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
            cVar7 = (char)poVar4;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar7);
            std::ostream::put(cVar7);
            std::ostream::flush();
            (this->spxout).m_verbosity = VVar2;
          }
          if ((DAT_003b9f60 < 2) && (0 < DAT_003b9fd0)) {
            this->_currentSettings->_intParamValues[2] = 1;
          }
          dVar20 = SPxSolverBase<double>::entertol(this_00);
          if (1e-06 <= dVar20) {
            (this->_solver).entertolscale = 0.001;
          }
          else {
            dVar20 = SPxSolverBase<double>::entertol(this_00);
            (this->_solver).entertolscale = 1e-09 / dVar20;
          }
          dVar20 = SPxSolverBase<double>::entertol(this_00);
          bVar6 = dVar20 <= 1e-09;
          bVar11 = false;
        }
      }
      else {
        VVar2 = (this->spxout).m_verbosity;
        if (2 < (int)VVar2) {
          (this->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->spxout).m_streams[3],"Relaxing tolerances.",0x14);
          poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
          cVar7 = (char)poVar4;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
          (this->spxout).m_verbosity = VVar2;
        }
        if ((DAT_003b9f60 < 1) && (-1 < DAT_003b9fd0)) {
          this->_currentSettings->_intParamValues[2] = 0;
        }
        dVar20 = SPxSolverBase<double>::entertol(this_00);
        if (dVar20 <= 1e-06) {
          (this->_solver).entertolscale = 1000.0;
        }
        else {
          dVar20 = SPxSolverBase<double>::entertol(this_00);
          (this->_solver).entertolscale = 0.001 / dVar20;
        }
        dVar20 = SPxSolverBase<double>::leavetol(this_00);
        if (dVar20 <= 1e-06) {
          (this->_solver).leavetolscale = 1000.0;
        }
        else {
          dVar20 = SPxSolverBase<double>::leavetol(this_00);
          (this->_solver).leavetolscale = 0.001 / dVar20;
        }
        dVar20 = SPxSolverBase<double>::entertol(this_00);
        bVar5 = 0.001 <= dVar20;
        bVar11 = false;
      }
      goto LAB_003472b2;
    }
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Switching scaling.",0x12);
      poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar7 = (char)poVar4;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar2;
    }
    if (value_02 == 0) {
      iVar17 = 2;
    }
    else {
      iVar17 = 0;
    }
    setIntParam(this,SCALER,iVar17,true);
    bVar12 = true;
  }
  else {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Turning off preprocessing.",0x1a);
      poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar7 = (char)poVar4;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar2;
    }
    setIntParam(this,SCALER,0,true);
    setIntParam(this,SIMPLIFIER,0,true);
    bVar18 = true;
  }
LAB_003475aa:
  bVar11 = true;
  fromscratch = true;
  goto LAB_003472b2;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::_solveRealStable(bool acceptUnbounded,
      bool acceptInfeasible, VectorBase<R>& primal, VectorBase<R>& dual,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols,
      const bool forceNoSimplifier)
{
   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

   bool fromScratch = false;
   bool solved = false;
   bool solvedFromScratch = false;
   bool initialSolve = true;
   bool increasedMarkowitz = false;
   bool relaxedTolerances = false;
   bool tightenedTolerances = false;
   bool switchedScaler = false;
   bool switchedSimplifier = false;
   bool switchedRatiotester = false;
   bool switchedPricer = false;
   bool turnedoffPre = false;

   R markowitz = _slufactor.markowitz();
   int ratiotester = intParam(SoPlexBase<R>::RATIOTESTER);
   int pricer = intParam(SoPlexBase<R>::PRICER);
   int simplifier = intParam(SoPlexBase<R>::SIMPLIFIER);
   int scaler = intParam(SoPlexBase<R>::SCALER);
   int type = intParam(SoPlexBase<R>::ALGORITHM);

   if(forceNoSimplifier)
      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

   while(true)
   {
      assert(!increasedMarkowitz || GE(_slufactor.markowitz(), R(0.9), this->tolerances()->epsilon()));

      result = _solveRealForRational(fromScratch, primal, dual, basisStatusRows, basisStatusCols);

      solved = (result == SPxSolverBase<R>::OPTIMAL)
               || (result == SPxSolverBase<R>::INFEASIBLE && acceptInfeasible)
               || (result == SPxSolverBase<R>::UNBOUNDED && acceptUnbounded);

      if(solved || result == SPxSolverBase<R>::ABORT_TIME || result == SPxSolverBase<R>::ABORT_ITER)
         break;

      if(initialSolve)
      {
         SPX_MSG_INFO1(spxout, spxout << "Numerical troubles during floating-point solve." << std::endl);
         initialSolve = false;
      }

      if(!turnedoffPre
            && (intParam(SoPlexBase<R>::SIMPLIFIER) != SoPlexBase<R>::SIMPLIFIER_OFF
                || intParam(SoPlexBase<R>::SCALER) != SoPlexBase<R>::SCALER_OFF))
      {
         SPX_MSG_INFO1(spxout, spxout << "Turning off preprocessing." << std::endl);

         turnedoffPre = true;

         setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);
         setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SCALER, scaler);
      setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);

      if(!increasedMarkowitz)
      {
         SPX_MSG_INFO1(spxout, spxout << "Increasing Markowitz threshold." << std::endl);

         _slufactor.setMarkowitz(0.9);
         increasedMarkowitz = true;

         try
         {
            _solver.factorize();
            continue;
         }
         catch(...)
         {
            SPxOut::debug(this, "Factorization failed.\n");
         }
      }

      if(!solvedFromScratch)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solving from scratch." << std::endl);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
      setIntParam(SoPlexBase<R>::PRICER, pricer);

      if(!switchedScaler)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching scaling." << std::endl);

         if(scaler == int(SoPlexBase<R>::SCALER_OFF))
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_BIEQUI);
         else
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedScaler = true;
         continue;
      }

      if(!switchedSimplifier && !forceNoSimplifier)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching simplification." << std::endl);

         if(simplifier == int(SoPlexBase<R>::SIMPLIFIER_OFF))
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_INTERNAL);
         else
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedSimplifier = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

      if(!relaxedTolerances)
      {
         SPX_MSG_INFO1(spxout, spxout << "Relaxing tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_PRIMAL);

         // scale tols by up 1e3 but so that they do not exceed 1e-3
         if(_solver.entertol() > 1e-6)
            _solver.scaleEntertol(1e-3 / _solver.entertol());
         else
            _solver.scaleEntertol(1e3);

         if(_solver.leavetol() > 1e-6)
            _solver.scaleLeavetol(1e-3 / _solver.leavetol());
         else
            _solver.scaleLeavetol(1e3);

         relaxedTolerances = _solver.entertol() >= 1e-3;
         solvedFromScratch = false;
         continue;
      }

      if(!tightenedTolerances && result != SPxSolverBase<R>::INFEASIBLE)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tightening tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_DUAL);

         // scale tols by up 1e-3 but so that they are not smaller than 1e-9
         if(_solver.entertol() < 1e-6)
            _solver.scaleEntertol(1e-9 / _solver.entertol());
         else
            _solver.scaleEntertol(1e-3);

         tightenedTolerances = _solver.entertol() <= 1e-9;
         solvedFromScratch = false;
         continue;
      }

      setIntParam(SoPlexBase<R>::ALGORITHM, type);

      if(!switchedRatiotester)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching ratio test." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.ratiotester() != (SPxRatioTester<R>*)&_ratiotesterTextbook)
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_TEXTBOOK);
         else
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_FAST);

         switchedRatiotester = true;
         solvedFromScratch = false;
         continue;
      }

      if(!switchedPricer)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching pricer." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.pricer() != (SPxPricer<R>*)&_pricerDevex)
            setIntParam(SoPlexBase<R>::PRICER, PRICER_DEVEX);
         else
            setIntParam(SoPlexBase<R>::PRICER, PRICER_STEEP);

         switchedPricer = true;
         solvedFromScratch = false;
         continue;
      }

      SPX_MSG_INFO1(spxout, spxout << "Giving up." << std::endl);

      break;
   }

   _slufactor.setMarkowitz(markowitz);

   setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
   setIntParam(SoPlexBase<R>::PRICER, pricer);
   setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);
   setIntParam(SoPlexBase<R>::SCALER, scaler);
   setIntParam(SoPlexBase<R>::ALGORITHM, type);

   return result;
}